

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O2

void Assimp::IFC::MakeDisjunctWindowContours
               (vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *a,
               vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *b,ExPolygons *out)

{
  pointer paVar1;
  bool bVar2;
  IfcVector2 *pip_1;
  pointer paVar3;
  IfcVector2 *pip;
  double dVar4;
  Polygon clip;
  IntPoint local_108;
  ExPolygons *local_f8;
  Clipper clipper;
  
  local_f8 = out;
  std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::clear(out);
  ClipperLib::Clipper::Clipper(&clipper);
  clip.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  clip.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  clip.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = (a->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  for (paVar3 = (a->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
                _M_impl.super__Vector_impl_data._M_start; paVar3 != paVar1; paVar3 = paVar3 + 1) {
    dVar4 = paVar3->x * 1518500249.0;
    local_108.X = (long64)dVar4;
    local_108.X = (long)(dVar4 - 9.223372036854776e+18) & local_108.X >> 0x3f | local_108.X;
    dVar4 = paVar3->y * 1518500249.0;
    local_108.Y = (long64)dVar4;
    local_108.Y = (long)(dVar4 - 9.223372036854776e+18) & local_108.Y >> 0x3f | local_108.Y;
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
    emplace_back<ClipperLib::IntPoint>(&clip,&local_108);
  }
  bVar2 = ClipperLib::Orientation(&clip);
  if (bVar2) {
    std::
    __reverse<__gnu_cxx::__normal_iterator<ClipperLib::IntPoint*,std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>
              (clip.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_start,
               clip.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  }
  ClipperLib::ClipperBase::AddPolygon
            ((ClipperBase *)(clipper._vptr_Clipper[-3] + (long)&clipper),&clip,ptClip);
  if (clip.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      clip.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_start) {
    clip.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
    super__Vector_impl_data._M_finish =
         clip.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
         _M_impl.super__Vector_impl_data._M_start;
  }
  paVar1 = (b->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  for (paVar3 = (b->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
                _M_impl.super__Vector_impl_data._M_start; paVar3 != paVar1; paVar3 = paVar3 + 1) {
    dVar4 = paVar3->x * 1518500249.0;
    local_108.X = (long64)dVar4;
    local_108.X = (long)(dVar4 - 9.223372036854776e+18) & local_108.X >> 0x3f | local_108.X;
    dVar4 = paVar3->y * 1518500249.0;
    local_108.Y = (long64)dVar4;
    local_108.Y = (long)(dVar4 - 9.223372036854776e+18) & local_108.Y >> 0x3f | local_108.Y;
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
    emplace_back<ClipperLib::IntPoint>(&clip,&local_108);
  }
  bVar2 = ClipperLib::Orientation(&clip);
  if (bVar2) {
    std::
    __reverse<__gnu_cxx::__normal_iterator<ClipperLib::IntPoint*,std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>
              (clip.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_start,
               clip.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  }
  ClipperLib::ClipperBase::AddPolygon
            ((ClipperBase *)(clipper._vptr_Clipper[-3] + (long)&clipper._vptr_Clipper),&clip,
             ptSubject);
  ClipperLib::Clipper::Execute(&clipper,ctDifference,local_f8,pftNonZero,pftNonZero);
  std::_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~_Vector_base
            (&clip.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>);
  ClipperLib::Clipper::~Clipper(&clipper);
  return;
}

Assistant:

void MakeDisjunctWindowContours (const std::vector<IfcVector2>& a,
    const std::vector<IfcVector2>& b,
    ClipperLib::ExPolygons& out)
{
    out.clear();

    ClipperLib::Clipper clipper;
    ClipperLib::Polygon clip;

    for(const IfcVector2& pip : a) {
        clip.push_back(ClipperLib::IntPoint(  to_int64(pip.x), to_int64(pip.y) ));
    }

    if (ClipperLib::Orientation(clip)) {
        std::reverse(clip.begin(), clip.end());
    }

    clipper.AddPolygon(clip, ClipperLib::ptClip);
    clip.clear();

    for(const IfcVector2& pip : b) {
        clip.push_back(ClipperLib::IntPoint(  to_int64(pip.x), to_int64(pip.y) ));
    }

    if (ClipperLib::Orientation(clip)) {
        std::reverse(clip.begin(), clip.end());
    }

    clipper.AddPolygon(clip, ClipperLib::ptSubject);
    clipper.Execute(ClipperLib::ctDifference, out,ClipperLib::pftNonZero,ClipperLib::pftNonZero);
}